

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

AllocList *
absl::lts_20250127::base_internal::LLA_SkiplistSearch(AllocList *head,AllocList *e,AllocList **prev)

{
  AllocList *pAVar1;
  AllocList *local_48;
  AllocList *n;
  AllocList *pAStack_28;
  int level;
  AllocList *p;
  AllocList **prev_local;
  AllocList *e_local;
  AllocList *head_local;
  
  n._4_4_ = head->levels;
  pAStack_28 = head;
  while (n._4_4_ = n._4_4_ + -1, pAVar1 = pAStack_28, -1 < n._4_4_) {
    do {
      pAStack_28 = pAVar1;
      pAVar1 = pAStack_28->next[n._4_4_];
    } while (pAVar1 != (AllocList *)0x0 && pAVar1 < e);
    prev[n._4_4_] = pAStack_28;
  }
  if (head->levels == 0) {
    local_48 = (AllocList *)0x0;
  }
  else {
    local_48 = (*prev)->next[0];
  }
  return local_48;
}

Assistant:

static AllocList *LLA_SkiplistSearch(AllocList *head, AllocList *e,
                                     AllocList **prev) {
  AllocList *p = head;
  for (int level = head->levels - 1; level >= 0; level--) {
    for (AllocList *n; (n = p->next[level]) != nullptr && n < e; p = n) {
    }
    prev[level] = p;
  }
  return (head->levels == 0) ? nullptr : prev[0]->next[0];
}